

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O0

void __thiscall re2::SparseSet::insert_new(SparseSet *this,int i)

{
  bool bVar1;
  int i_local;
  SparseSet *this_local;
  
  if ((uint)i < (uint)this->max_size_) {
    bVar1 = contains(this,i);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!contains(i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_set.h"
                    ,0x99,"void re2::SparseSet::insert_new(int)");
    }
    if (this->max_size_ <= this->size_) {
      __assert_fail("(size_) < (max_size_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_set.h"
                    ,0x9a,"void re2::SparseSet::insert_new(int)");
    }
    this->sparse_to_dense_[i] = this->size_;
    this->dense_[this->size_] = i;
    this->size_ = this->size_ + 1;
  }
  return;
}

Assistant:

void insert_new(int i) {
    if (static_cast<uint>(i) >= static_cast<uint>(max_size_)) {
      // Semantically, end() would be better here, but we already know
      // the user did something stupid, so begin() insulates them from
      // dereferencing an invalid pointer.
      return;
    }
    DCHECK(!contains(i));
    DCHECK_LT(size_, max_size_);
    sparse_to_dense_[i] = size_;
    dense_[size_] = i;
    size_++;
  }